

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O0

YSRESULT __thiscall YsSoundPlayer::SoundData::ConvertToStereo(SoundData *this)

{
  uchar *puVar1;
  uint local_34;
  int i_1;
  uchar *newDat_1;
  int i;
  uchar *newDat;
  SoundData *this_local;
  
  if (this->stereo == YSTRUE) {
    this_local._4_4_ = YSOK;
  }
  else if (this->bit == 8) {
    puVar1 = (uchar *)operator_new__((ulong)(this->sizeInBytes << 1));
    for (newDat_1._4_4_ = 0; newDat_1._4_4_ < this->sizeInBytes; newDat_1._4_4_ = newDat_1._4_4_ + 1
        ) {
      puVar1[(int)(newDat_1._4_4_ << 1)] = this->dat[(int)newDat_1._4_4_];
      puVar1[(int)(newDat_1._4_4_ * 2 + 1)] = this->dat[(int)newDat_1._4_4_];
    }
    if (this->dat != (uchar *)0x0) {
      operator_delete__(this->dat);
    }
    this->dat = puVar1;
    this->stereo = YSTRUE;
    this->sizeInBytes = this->sizeInBytes << 1;
    this_local._4_4_ = YSOK;
  }
  else if (this->bit == 0x10) {
    puVar1 = (uchar *)operator_new__((ulong)(this->sizeInBytes << 1));
    for (local_34 = 0; local_34 < this->sizeInBytes; local_34 = local_34 + 2) {
      puVar1[(int)(local_34 << 1)] = this->dat[(int)local_34];
      puVar1[(int)(local_34 * 2 + 1)] = this->dat[(int)(local_34 + 1)];
      puVar1[(int)(local_34 * 2 + 2)] = this->dat[(int)local_34];
      puVar1[(int)(local_34 * 2 + 3)] = this->dat[(int)(local_34 + 1)];
    }
    this->dat = puVar1;
    this->stereo = YSTRUE;
    this->sizeInBytes = this->sizeInBytes << 1;
    this_local._4_4_ = YSOK;
  }
  else {
    this_local._4_4_ = YSERR;
  }
  return this_local._4_4_;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::ConvertToStereo(void)
{
	if(stereo==YSTRUE)
	{
		return YSOK;
	}
	else
	{
		if(bit==8)
		{
			unsigned char *newDat=new unsigned char [sizeInBytes*2];
			for(int i=0; i<sizeInBytes; i++)
			{
				newDat[i*2  ]=dat[i];
				newDat[i*2+1]=dat[i];
			}
			delete [] dat;
			dat=newDat;
			stereo=YSTRUE;
			sizeInBytes*=2;
			return YSOK;
		}
		else if(bit==16)
		{
			unsigned char *newDat=new unsigned char [sizeInBytes*2];
			for(int i=0; i<sizeInBytes; i+=2)
			{
				newDat[i*2  ]=dat[i];
				newDat[i*2+1]=dat[i+1];
				newDat[i*2+2]=dat[i];
				newDat[i*2+3]=dat[i+1];
			}
			dat=newDat;
			stereo=YSTRUE;
			sizeInBytes*=2;
			return YSOK;
		}
	}
	return YSERR;
}